

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conspage.c
# Opt level: O3

ConsCell * find_pair_in_page(conspage *pg,LispPTR cdrval)

{
  uint uVar1;
  uint uVar2;
  ConsCell CVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ConsCell *pCVar13;
  
  uVar1 = *(uint *)&pg->field_0x8;
  if (uVar1 < 0x2000000) {
    return (ConsCell *)0x0;
  }
  uVar5 = uVar1 >> 0x10 & 0xff;
  if (uVar5 == 0) {
    return (ConsCell *)0x0;
  }
  uVar4 = 0;
  uVar10 = 0;
  do {
    uVar6 = uVar5;
    if (uVar10 != 0) {
      if (uVar10 <= uVar6 + 0xe && uVar6 < uVar10) {
        uVar5 = 0;
        uVar2 = uVar6;
        break;
      }
      if (uVar6 <= uVar10 + 0xe && uVar10 < uVar6) {
        pCVar13 = (ConsCell *)((long)&pg->cell6 + (ulong)uVar10 * 2);
        uVar11 = (ulong)uVar6;
        uVar5 = *(uint *)((long)&pg->cell6 + uVar11 * 2);
        if ((int)uVar4 == 0) {
          *(uint *)&pg->field_0x8 = uVar1 & 0xff00ffff | uVar5 >> 8 & 0xff0000;
        }
        else {
          *(char *)((long)&pg->cell6 + uVar4 * 2 + 3) = (char)(uVar5 >> 0x18);
        }
        lVar7 = (long)(uVar11 * 2 + (ulong)uVar10 * -2) >> 2;
        CVar3 = (ConsCell)((uint)*pCVar13 & 0xfffffff | (int)lVar7 << 0x1c);
        *pCVar13 = CVar3;
        if (7 < lVar7) {
          error("in find_pair_in_page, cdr code too big.");
          CVar3 = *pCVar13;
        }
        uVar5 = uVar10 + ((uint)CVar3 >> 0x1c) * 2;
        goto LAB_00114cfa;
      }
    }
    uVar2 = *(uint *)((long)&pg->cell6 + (ulong)uVar6 * 2);
    uVar4 = (ulong)uVar10;
    uVar5 = uVar2 >> 0x18;
    uVar10 = uVar6;
    if (uVar2 < 0x1000000) {
      return (ConsCell *)0x0;
    }
  } while( true );
  while (uVar2 = uVar10, uVar6 < uVar10) {
    uVar8 = uVar5;
    uVar5 = uVar6;
    uVar9 = (ulong)uVar2;
    uVar12 = (ulong)uVar5;
    uVar6 = *(uint *)((long)&pg->cell6 + uVar12 * 2) >> 0x18;
    if (uVar6 <= uVar5) break;
  }
  uVar11 = (ulong)uVar10;
  uVar10 = *(uint *)((long)&pg->cell6 + uVar9 * 2);
  if ((int)uVar4 == 0) {
    *(uint *)&pg->field_0x8 = uVar1 & 0xff00ffff | uVar10 >> 8 & 0xff0000;
  }
  else {
    *(char *)((long)&pg->cell6 + uVar4 * 2 + 3) = (char)(uVar10 >> 0x18);
  }
  pCVar13 = (ConsCell *)((long)&pg->cell6 + uVar12 * 2);
  if (uVar8 != 0) {
    *(undefined1 *)((long)&pg->cell6 + (ulong)uVar8 * 2 + 3) = pCVar13->field_0x3;
  }
  lVar7 = (long)(uVar11 * 2 + uVar12 * -2) >> 2;
  CVar3 = (ConsCell)((uint)*pCVar13 & 0xfffffff | (int)lVar7 << 0x1c);
  *pCVar13 = CVar3;
  if (7 < lVar7) {
    error("in find_pair_in_page, cdr code too big.");
    CVar3 = *pCVar13;
  }
  uVar5 = uVar5 + ((uint)CVar3 >> 0x1c) * 2;
LAB_00114cfa:
  if (0xfe < uVar5) {
    error("in fpip, page overflow.");
  }
  pg->field_0xb = (char)((uint)(byte)pg->field_0xb * 0x1000000 + -0x2000000 >> 0x18);
  *(LispPTR *)((long)&pg->cell6 + uVar11 * 2) = cdrval;
  return pCVar13;
}

Assistant:

static ConsCell *find_pair_in_page(struct conspage *pg, LispPTR cdrval) {
  ConsCell *carcell, *cdrcell;
  unsigned int offset, prior, priorprior, noffset, nprior, poffset;

  if (pg->count < 2) return ((ConsCell *)0);

  priorprior = prior = nprior = 0;

  for (offset = pg->next_cell; offset; offset = FREECONS(pg, offset)->next_free) {
    if (prior) {
      /* if ((6^prior) <= (6^offset)) error("free list in CONS page corrupt."); */
      if ((prior > offset) && (prior <= offset + 14)) {
        poffset = offset;
        noffset = FREECONS(pg, offset)->next_free;
        while ((noffset > offset) && (noffset < prior)) {
          nprior = offset;
          poffset = prior;
          offset = noffset;
          noffset = FREECONS(pg, offset)->next_free;
        }
        carcell = (ConsCell *)((DLword *)pg + offset);
        cdrcell = (ConsCell *)((DLword *)pg + prior);
        if (priorprior)
          FREECONS(pg, priorprior)->next_free = FREECONS(pg, poffset)->next_free;
        else
          pg->next_cell = FREECONS(pg, poffset)->next_free;
        if (nprior) FREECONS(pg, nprior)->next_free = FREECONS(pg, offset)->next_free;
        carcell->cdr_code = cdrcell - carcell;
#ifdef NEWCDRCODING
        if ((cdrcell - carcell) > 7) error("in find_pair_in_page, cdr code too big.");
        if (254 < (offset + (carcell->cdr_code << 1))) error("in fpip, page overflow.");
#endif /* NEWCDRCODING */
        pg->count -= 2;
        *((LispPTR *)cdrcell) = cdrval;
        return (carcell);
      } else if ((offset > prior) && (offset <= prior + 14)) {
        carcell = (ConsCell *)((DLword *)pg + prior);
        cdrcell = (ConsCell *)((DLword *)pg + offset);
        if (priorprior)
          FREECONS(pg, priorprior)->next_free = ((freecons *)cdrcell)->next_free;
        else
          pg->next_cell = ((freecons *)cdrcell)->next_free;
        carcell->cdr_code = cdrcell - carcell;
#ifdef NEWCDRCODING
        if ((cdrcell - carcell) > 7) error("in find_pair_in_page, cdr code too big.");
        if (254 < (prior + (carcell->cdr_code << 1))) error("in fpip, page overflow.");
#endif /* NEWCDRCODING */
        pg->count -= 2;
        *((LispPTR *)cdrcell) = cdrval;
        return (carcell);
      }
    }
    priorprior = prior;
    prior = offset;
  }
  return ((ConsCell *)0);
}